

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O3

void __thiscall irr::gui::CGUISkin::setSpriteBank(CGUISkin *this,IGUISpriteBank *bank)

{
  int *piVar1;
  IGUISpriteBank *pIVar2;
  _func_int *p_Var3;
  
  if (bank != (IGUISpriteBank *)0x0) {
    *(int *)(&bank->field_0x10 + (long)bank->_vptr_IGUISpriteBank[-3]) =
         *(int *)(&bank->field_0x10 + (long)bank->_vptr_IGUISpriteBank[-3]) + 1;
  }
  pIVar2 = this->SpriteBank;
  if (pIVar2 != (IGUISpriteBank *)0x0) {
    p_Var3 = pIVar2->_vptr_IGUISpriteBank[-3];
    piVar1 = (int *)(&pIVar2->field_0x10 + (long)p_Var3);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar2->_vptr_IGUISpriteBank + (long)p_Var3) + 8))();
    }
  }
  this->SpriteBank = bank;
  return;
}

Assistant:

void CGUISkin::setSpriteBank(IGUISpriteBank *bank)
{
	if (bank)
		bank->grab();

	if (SpriteBank)
		SpriteBank->drop();

	SpriteBank = bank;
}